

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArrayTextureSizeRTComputeShader::configureTextures
          (TextureCubeMapArrayTextureSizeRTComputeShader *this,GLuint width,GLuint height,
          GLuint depth,STORAGE_TYPE storType)

{
  int iVar1;
  deUint32 dVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined4 uVar4;
  long lVar3;
  
  uVar4 = (undefined4)((ulong)in_RAX >> 0x20);
  TextureCubeMapArrayTextureSizeBase::configureTextures
            ((TextureCubeMapArrayTextureSizeBase *)this,width,height,depth,storType);
  iVar1 = (*((this->super_TextureCubeMapArrayTextureSizeRTBase).
             super_TextureCubeMapArrayTextureSizeBase.super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  TextureCubeMapArrayTextureSizeBase::createCubeMapArrayTexture
            ((TextureCubeMapArrayTextureSizeBase *)this,&this->m_to_img_id,width,height,depth,
             storType,'\0');
  (**(code **)(lVar3 + 8))(0x84c2);
  (**(code **)(lVar3 + 0xb8))(0x9009,this->m_to_img_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error binding texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x641);
  (**(code **)(lVar3 + 0x80))(0,this->m_to_img_id,0,1,0,35000,CONCAT44(uVar4,0x8814));
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error binding texture object to image unit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x644);
  return;
}

Assistant:

void TextureCubeMapArrayTextureSizeRTComputeShader::configureTextures(glw::GLuint width, glw::GLuint height,
																	  glw::GLuint depth, STORAGE_TYPE storType)
{
	TextureCubeMapArrayTextureSizeRTBase::configureTextures(width, height, depth, storType);

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	createCubeMapArrayTexture(m_to_img_id, width, height, depth, storType, false);

	/* Binding texture object to texture unit */
	gl.activeTexture(GL_TEXTURE2);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, m_to_img_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");

	gl.bindImageTexture(0, m_to_img_id, 0, GL_TRUE, 0, GL_READ_ONLY, GL_RGBA32F);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit");
}